

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O3

void duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>
               (Vector *constant,Vector *other,Vector *result,DataChunk *args)

{
  _func_int **pp_Var1;
  VectorType VVar2;
  idx_t count;
  pointer pcVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var9;
  sel_t *psVar10;
  SelectionVector *pSVar11;
  byte bVar12;
  double dVar13;
  undefined1 auVar14 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  unsigned_long uVar17;
  string *psVar18;
  reference other_00;
  idx_t iVar19;
  _Head_base<0UL,_unsigned_long_*,_false> _Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  idx_t iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  char *other_str_begin;
  ulong uVar28;
  ulong *puVar29;
  idx_t idx_in_entry;
  idx_t iVar30;
  ValidityMask *this;
  ulong *puVar31;
  UnifiedVectorFormat ldata;
  CachedJaroSimilarity<char> cached;
  value_type score_cutoff;
  string str_val;
  Value val;
  ulong *local_228;
  ulong *local_220;
  undefined1 local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  unsigned_long *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  CachedJaroSimilarity<char> local_1c0;
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  ulong *local_150;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  ValidityMask local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  long local_d8;
  char local_d0 [16];
  idx_t local_c0;
  UnifiedVectorFormat local_b8;
  Value local_70;
  
  Vector::GetValue(&local_70,constant,0);
  count = args->count;
  if (local_70.is_null == true) {
    FlatVector::VerifyFlatVector(result);
    _Var20._M_head_impl =
         (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (_Var20._M_head_impl == (unsigned_long *)0x0) {
      local_1c0.s1._M_dataplus._M_p =
           (pointer)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_148,(unsigned_long *)&local_1c0);
      p_Var22 = p_Stack_140;
      auVar14 = local_148;
      local_148 = (undefined1  [8])0x0;
      p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var21 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)auVar14;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var22;
      if ((p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21),
         p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
      }
      pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      _Var20._M_head_impl =
           (pTVar16->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var20._M_head_impl;
    }
    if (count != 0) {
      uVar25 = count + 0x3f >> 6;
      if (uVar25 != 1) {
        switchD_012e3010::default(_Var20._M_head_impl,0,uVar25 * 8 - 8);
      }
      uVar17 = -1L << ((byte)count & 0x3f);
      if ((count & 0x3f) == 0) {
        uVar17 = 0;
      }
      _Var20._M_head_impl[uVar25 - 1] = uVar17;
    }
    goto LAB_01c440bb;
  }
  psVar18 = StringValue::Get_abi_cxx11_(&local_70);
  local_e0._M_current = local_d0;
  pcVar3 = (psVar18->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + psVar18->_M_string_length);
  duckdb_jaro_winkler::CachedJaroSimilarity<char>::
  CachedJaroSimilarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_1c0,local_e0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_e0._M_current + local_d8));
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd0) {
    if (other->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      pdVar6 = other->data;
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        if (count != 0) {
          local_228 = (ulong *)(pdVar6 + 8);
          iVar30 = 0;
          do {
            local_148 = (undefined1  [8])local_228[-1];
            p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_228;
            p_Var21 = p_Stack_140;
            if (SUB84(local_148,0) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_148 & 0xffffffff)),0.0);
            *(double *)(pdVar8 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
            local_228 = local_228 + 2;
          } while (count != iVar30);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          uVar26 = 0;
          uVar25 = 0;
          do {
            puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar24 = uVar25 + 0x40;
              if (count <= uVar25 + 0x40) {
                uVar24 = count;
              }
LAB_01c43cf7:
              uVar27 = uVar25;
              if (uVar25 < uVar24) {
                puVar31 = (ulong *)(pdVar6 + uVar25 * 0x10 + 8);
                do {
                  local_148 = (undefined1  [8])puVar31[-1];
                  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar31;
                  p_Var21 = p_Stack_140;
                  if (SUB84(local_148,0) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                  }
                  dVar13 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_148 & 0xffffffff)),0.0);
                  *(double *)(pdVar8 + uVar25 * 8) = dVar13;
                  uVar25 = uVar25 + 1;
                  puVar31 = puVar31 + 2;
                  uVar27 = uVar24;
                } while (uVar24 != uVar25);
              }
            }
            else {
              uVar7 = puVar5[uVar26];
              uVar24 = uVar25 + 0x40;
              if (count <= uVar25 + 0x40) {
                uVar24 = count;
              }
              uVar27 = uVar24;
              if (uVar7 != 0) {
                if (uVar7 == 0xffffffffffffffff) goto LAB_01c43cf7;
                uVar27 = uVar25;
                if (uVar25 < uVar24) {
                  puVar31 = (ulong *)(pdVar6 + uVar25 * 0x10 + 8);
                  uVar28 = 0;
                  do {
                    if ((uVar7 >> (uVar28 & 0x3f) & 1) != 0) {
                      local_148 = (undefined1  [8])puVar31[-1];
                      p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar31;
                      p_Var21 = p_Stack_140;
                      if (SUB84(local_148,0) < 0xd) {
                        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                      }
                      dVar13 = duckdb_jaro_winkler::detail::
                               jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                         (&local_1c0.PM,
                                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )local_1c0.s1._M_dataplus._M_p,
                                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )(local_1c0.s1._M_dataplus._M_p +
                                            local_1c0.s1._M_string_length),(char *)p_Var21,
                                          (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                  ((ulong)local_148 & 0xffffffff)),0.0);
                      *(double *)(pdVar8 + uVar28 * 8 + uVar25 * 8) = dVar13;
                    }
                    uVar28 = uVar28 + 1;
                    puVar31 = puVar31 + 2;
                    uVar27 = uVar24;
                  } while (uVar24 - uVar25 != uVar28);
                }
              }
            }
            uVar26 = uVar26 + 1;
            uVar25 = uVar27;
          } while (uVar26 != count + 0x3f >> 6);
        }
      }
    }
    else if (other->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar4 = (double *)result->data;
      puVar31 = (ulong *)other->data;
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        ConstantVector::SetNull(result,false);
        local_148 = (undefined1  [8])*puVar31;
        p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar31[1];
        p_Var21 = p_Stack_140;
        if (SUB84(local_148,0) < 0xd) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
        }
        dVar13 = duckdb_jaro_winkler::detail::
                 jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_1c0.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_1c0.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                            (char *)p_Var21,
                            (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                    ((ulong)local_148 & 0xffffffff)),0.0);
        *pdVar4 = dVar13;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_148);
      Vector::ToUnifiedFormat(other,count,(UnifiedVectorFormat *)local_148);
      Vector::SetVectorType(result,FLAT_VECTOR);
      p_Var21 = p_Stack_140;
      auVar14 = local_148;
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_138 == (element_type *)0x0) {
        if (count != 0) {
          _Var9._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)auVar14)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          iVar30 = 0;
          do {
            iVar19 = iVar30;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var9._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar19 = (idx_t)*(uint *)((long)_Var9._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar30 * 4);
            }
            local_208 = (undefined1  [8])p_Var21[iVar19]._vptr__Sp_counted_base;
            p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[iVar19]._M_use_count;
            p_Var22 = p_Stack_200;
            if (SUB84(local_208,0) < 0xd) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var22,
                                (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),0.0);
            *(double *)(pdVar8 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
          } while (count != iVar30);
        }
      }
      else if (count != 0) {
        _Var9._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)auVar14)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        uVar25 = 0;
        do {
          uVar26 = uVar25;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var9._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar26 = (ulong)*(uint *)((long)_Var9._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar25 * 4);
          }
          if (((ulong)(&local_138->_vptr_ExtraTypeInfo)[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) == 0) {
            _Var20._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var20._M_head_impl == (unsigned_long *)0x0) {
              local_b8.sel = (SelectionVector *)
                             (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_208,(unsigned_long *)&local_b8);
              p_Var15 = p_Stack_200;
              auVar14 = local_208;
              local_208 = (undefined1  [8])0x0;
              p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var22 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var15;
              if ((p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22),
                 p_Stack_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_200);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var20._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var20._M_head_impl;
            }
            bVar12 = (byte)uVar25 & 0x3f;
            _Var20._M_head_impl[uVar25 >> 6] =
                 _Var20._M_head_impl[uVar25 >> 6] &
                 (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
          }
          else {
            local_208 = (undefined1  [8])p_Var21[uVar26]._vptr__Sp_counted_base;
            p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[uVar26]._M_use_count;
            p_Var22 = p_Stack_200;
            if (SUB84(local_208,0) < 0xd) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var22,
                                (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),0.0);
            *(double *)(pdVar8 + uVar25 * 8) = dVar13;
          }
          uVar25 = uVar25 + 1;
        } while (count != uVar25);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_120.super_TemplatedValidityMask<unsigned_long>.capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_120.super_TemplatedValidityMask<unsigned_long>.capacity);
      }
      if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
      }
    }
  }
  else {
    other_00 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
    Vector::Vector((Vector *)local_148,other_00);
    VVar2 = other->vector_type;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && ((byte)local_148[0] ^ 2) == 0) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = (double *)result->data;
      if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
         ((local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((*local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)))) {
        local_208 = *(undefined1 (*) [8])other->data;
        p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)other->data + 8);
        p_Var21 = p_Stack_200;
        if (SUB84(local_208,0) < 0xd) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
        }
        dVar13 = duckdb_jaro_winkler::detail::
                 jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_1c0.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_1c0.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                            (char *)p_Var21,
                            (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                    ((ulong)local_208 & 0xffffffff)),
                            (double)(local_128._M_pi)->_vptr__Sp_counted_base);
        *pdVar4 = dVar13;
      }
      else {
LAB_01c44017:
        ConstantVector::SetNull(result,true);
      }
    }
    else if (((byte)local_148[0] ^ 2) == 0 && VVar2 == FLAT_VECTOR) {
      pdVar8 = other->data;
      if ((local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((*local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) == 0)) {
LAB_01c4400a:
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        goto LAB_01c44017;
      }
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar6 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          pp_Var1 = (local_128._M_pi)->_vptr__Sp_counted_base;
          local_220 = (ulong *)(pdVar8 + 8);
          iVar30 = 0;
          do {
            local_208 = (undefined1  [8])local_220[-1];
            p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_220;
            p_Var21 = p_Stack_200;
            if (SUB84(local_208,0) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),(double)pp_Var1);
            *(double *)(pdVar6 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
            local_220 = local_220 + 2;
          } while (count != iVar30);
        }
      }
      else if (0x3f < count + 0x3f) {
        uVar26 = 0;
        uVar25 = 0;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar24 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar24 = count;
            }
LAB_01c43ba1:
            uVar27 = uVar25;
            if (uVar25 < uVar24) {
              pp_Var1 = (local_128._M_pi)->_vptr__Sp_counted_base;
              puVar31 = (ulong *)(pdVar8 + uVar25 * 0x10 + 8);
              do {
                local_208 = (undefined1  [8])puVar31[-1];
                p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar31;
                p_Var21 = p_Stack_200;
                if (SUB84(local_208,0) < 0xd) {
                  p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                }
                dVar13 = duckdb_jaro_winkler::detail::
                         jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_1c0.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_1c0.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length
                                      ),(char *)p_Var21,
                                    (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                            ((ulong)local_208 & 0xffffffff)),(double)pp_Var1);
                *(double *)(pdVar6 + uVar25 * 8) = dVar13;
                uVar25 = uVar25 + 1;
                puVar31 = puVar31 + 2;
                uVar27 = uVar24;
              } while (uVar24 != uVar25);
            }
          }
          else {
            uVar7 = puVar5[uVar26];
            uVar24 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar24 = count;
            }
            uVar27 = uVar24;
            if (uVar7 != 0) {
              if (uVar7 == 0xffffffffffffffff) goto LAB_01c43ba1;
              uVar27 = uVar25;
              if (uVar25 < uVar24) {
                puVar31 = (ulong *)(pdVar8 + uVar25 * 0x10 + 8);
                uVar28 = 0;
                do {
                  if ((uVar7 >> (uVar28 & 0x3f) & 1) != 0) {
                    local_208 = (undefined1  [8])puVar31[-1];
                    p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar31;
                    p_Var21 = p_Stack_200;
                    if (SUB84(local_208,0) < 0xd) {
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                    }
                    dVar13 = duckdb_jaro_winkler::detail::
                             jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_1c0.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_1c0.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_1c0.s1._M_dataplus._M_p +
                                          local_1c0.s1._M_string_length),(char *)p_Var21,
                                        (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                ((ulong)local_208 & 0xffffffff)),
                                        (double)(local_128._M_pi)->_vptr__Sp_counted_base);
                    *(double *)(pdVar6 + uVar28 * 8 + uVar25 * 8) = dVar13;
                  }
                  uVar28 = uVar28 + 1;
                  puVar31 = puVar31 + 2;
                  uVar27 = uVar24;
                } while (uVar24 - uVar25 != uVar28);
              }
            }
          }
          uVar26 = uVar26 + 1;
          uVar25 = uVar27;
        } while (uVar26 != count + 0x3f >> 6);
      }
    }
    else if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && local_148[0] == (duckdb)0x0) {
      puVar31 = (ulong *)other->data;
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) goto LAB_01c4400a;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector((Vector *)local_148);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &local_120.super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           local_120.super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          pSVar11 = (SelectionVector *)*puVar31;
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar31[1];
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
          if (0xc < (uint)pSVar11) {
            p_Var22 = p_Var21;
          }
          iVar30 = 0;
          do {
            local_208 = (undefined1  [8])pSVar11;
            p_Stack_200 = p_Var21;
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var22,
                                (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                        ((ulong)pSVar11 & 0xffffffff)),
                                (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[iVar30]);
            *(double *)(pdVar8 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
          } while (count != iVar30);
        }
      }
      else if (0x3f < count + 0x3f) {
        uVar26 = 0;
        uVar25 = 0;
        local_150 = puVar31;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar24 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar24 = count;
            }
LAB_01c4445d:
            uVar27 = uVar25;
            if (uVar25 < uVar24) {
              pSVar11 = (SelectionVector *)*puVar31;
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar31[1];
              p_Var22 = p_Var21;
              if ((uint)pSVar11 < 0xd) {
                p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
              }
              do {
                local_208 = (undefined1  [8])pSVar11;
                p_Stack_200 = p_Var21;
                dVar13 = duckdb_jaro_winkler::detail::
                         jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_1c0.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_1c0.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length
                                      ),(char *)p_Var22,
                                    (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                            ((ulong)pSVar11 & 0xffffffff)),
                                    (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[uVar25]);
                *(double *)(pdVar8 + uVar25 * 8) = dVar13;
                uVar25 = uVar25 + 1;
                puVar31 = local_150;
                uVar27 = uVar24;
              } while (uVar24 != uVar25);
            }
          }
          else {
            uVar7 = puVar5[uVar26];
            uVar24 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar24 = count;
            }
            uVar27 = uVar24;
            if (uVar7 != 0) {
              if (uVar7 == 0xffffffffffffffff) goto LAB_01c4445d;
              uVar27 = uVar25;
              if (uVar25 < uVar24) {
                uVar28 = 0;
                do {
                  if ((uVar7 >> (uVar28 & 0x3f) & 1) != 0) {
                    local_208 = (undefined1  [8])*puVar31;
                    p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar31[1];
                    p_Var21 = p_Stack_200;
                    if (SUB84(local_208,0) < 0xd) {
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                    }
                    dVar13 = duckdb_jaro_winkler::detail::
                             jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_1c0.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_1c0.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_1c0.s1._M_dataplus._M_p +
                                          local_1c0.s1._M_string_length),(char *)p_Var21,
                                        (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                ((ulong)local_208 & 0xffffffff)),
                                        (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)
                                                [uVar25 + uVar28]);
                    *(double *)(pdVar8 + uVar28 * 8 + uVar25 * 8) = dVar13;
                  }
                  uVar28 = uVar28 + 1;
                  uVar27 = uVar24;
                } while (uVar24 - uVar25 != uVar28);
              }
            }
          }
          uVar26 = uVar26 + 1;
          uVar25 = uVar27;
        } while (uVar26 != count + 0x3f >> 6);
      }
    }
    else if (local_148[0] == (duckdb)0x0 && VVar2 == FLAT_VECTOR) {
      pdVar8 = other->data;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar6 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      FlatVector::VerifyFlatVector((Vector *)local_148);
      this = &result->validity;
      ValidityMask::Combine(this,&local_120,count);
      if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
      {
        if (count != 0) {
          puVar31 = (ulong *)(pdVar8 + 8);
          iVar30 = 0;
          do {
            local_208 = (undefined1  [8])puVar31[-1];
            p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar31;
            p_Var21 = p_Stack_200;
            if (SUB84(local_208,0) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),
                                (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[iVar30]);
            *(double *)(pdVar6 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
            puVar31 = puVar31 + 2;
          } while (count != iVar30);
        }
      }
      else if (0x3f < count + 0x3f) {
        puVar31 = (ulong *)(pdVar8 + 8);
        uVar26 = 0;
        uVar25 = 0;
        local_150 = puVar31;
        do {
          puVar5 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar24 = uVar26 + 0x40;
            if (count <= uVar26 + 0x40) {
              uVar24 = count;
            }
LAB_01c447fe:
            uVar27 = uVar26;
            if (uVar26 < uVar24) {
              puVar29 = puVar31 + uVar26 * 2;
              do {
                local_208 = (undefined1  [8])puVar29[-1];
                p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar29;
                p_Var21 = p_Stack_200;
                if (SUB84(local_208,0) < 0xd) {
                  p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                }
                dVar13 = duckdb_jaro_winkler::detail::
                         jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_1c0.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_1c0.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length
                                      ),(char *)p_Var21,
                                    (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                            ((ulong)local_208 & 0xffffffff)),
                                    (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[uVar26]);
                *(double *)(pdVar6 + uVar26 * 8) = dVar13;
                uVar26 = uVar26 + 1;
                puVar29 = puVar29 + 2;
                uVar27 = uVar24;
              } while (uVar24 != uVar26);
            }
          }
          else {
            uVar7 = puVar5[uVar25];
            uVar24 = uVar26 + 0x40;
            if (count <= uVar26 + 0x40) {
              uVar24 = count;
            }
            uVar27 = uVar24;
            if (uVar7 != 0) {
              if (uVar7 == 0xffffffffffffffff) goto LAB_01c447fe;
              uVar27 = uVar26;
              if (uVar26 < uVar24) {
                puVar29 = puVar31 + uVar26 * 2;
                uVar28 = 0;
                do {
                  if ((uVar7 >> (uVar28 & 0x3f) & 1) != 0) {
                    local_208 = (undefined1  [8])puVar29[-1];
                    p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar29;
                    p_Var21 = p_Stack_200;
                    if (SUB84(local_208,0) < 0xd) {
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                    }
                    dVar13 = duckdb_jaro_winkler::detail::
                             jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_1c0.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_1c0.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_1c0.s1._M_dataplus._M_p +
                                          local_1c0.s1._M_string_length),(char *)p_Var21,
                                        (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                ((ulong)local_208 & 0xffffffff)),
                                        (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)
                                                [uVar26 + uVar28]);
                    *(double *)(pdVar6 + uVar28 * 8 + uVar26 * 8) = dVar13;
                  }
                  uVar28 = uVar28 + 1;
                  puVar29 = puVar29 + 2;
                  puVar31 = local_150;
                  uVar27 = uVar24;
                } while (uVar24 - uVar26 != uVar28);
              }
            }
          }
          uVar26 = uVar27;
          uVar25 = uVar25 + 1;
        } while (uVar25 != count + 0x3f >> 6);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_208);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
      Vector::ToUnifiedFormat(other,count,(UnifiedVectorFormat *)local_208);
      Vector::ToUnifiedFormat((Vector *)local_148,count,&local_b8);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pSVar11 = local_b8.sel;
      p_Var21 = p_Stack_200;
      auVar14 = local_208;
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 && local_1f8 == (unsigned_long *)0x0) {
        if (count != 0) {
          _Var9._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)auVar14)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          psVar10 = pSVar11->sel_vector;
          iVar30 = 0;
          do {
            iVar19 = iVar30;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var9._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar19 = (idx_t)*(uint *)((long)_Var9._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar30 * 4);
            }
            iVar23 = iVar30;
            if (psVar10 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar10[iVar30];
            }
            local_168 = (undefined1  [8])p_Var21[iVar19]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[iVar19]._M_use_count;
            p_Var22 = p_Stack_160;
            if (SUB84(local_168,0) < 0xd) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var22,
                                (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),
                                *(double *)(local_b8.data + iVar23 * 8));
            *(double *)(pdVar8 + iVar30 * 8) = dVar13;
            iVar30 = iVar30 + 1;
          } while (count != iVar30);
        }
      }
      else if (count != 0) {
        _Var9._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)auVar14)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        psVar10 = pSVar11->sel_vector;
        uVar25 = 0;
        do {
          uVar26 = uVar25;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var9._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar26 = (ulong)*(uint *)((long)_Var9._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar25 * 4);
          }
          uVar24 = uVar25;
          if (psVar10 != (sel_t *)0x0) {
            uVar24 = (ulong)psVar10[uVar25];
          }
          if (((local_1f8 == (unsigned_long *)0x0) ||
              ((local_1f8[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0)) &&
             ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)))) {
            local_168 = (undefined1  [8])p_Var21[uVar26]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[uVar26]._M_use_count;
            p_Var22 = p_Stack_160;
            if (SUB84(local_168,0) < 0xd) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar13 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var22,
                                (char *)((long)&p_Var22->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),
                                *(double *)(local_b8.data + uVar24 * 8));
            *(double *)(pdVar8 + uVar25 * 8) = dVar13;
          }
          else {
            _Var20._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var20._M_head_impl == (unsigned_long *)0x0) {
              local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_168,&local_c0);
              p_Var15 = p_Stack_160;
              auVar14 = local_168;
              local_168 = (undefined1  [8])0x0;
              p_Stack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var22 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var15;
              if ((p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22),
                 p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var20._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var20._M_head_impl;
            }
            bVar12 = (byte)uVar25 & 0x3f;
            _Var20._M_head_impl[uVar25 >> 6] =
                 _Var20._M_head_impl[uVar25 >> 6] &
                 (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
          }
          uVar25 = uVar25 + 1;
        } while (count != uVar25);
      }
      if (local_b8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
      }
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
      }
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
    if (local_120.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)&p_Stack_140);
  }
  if (local_1c0.PM.m_extendedAscii.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.PM.m_extendedAscii.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c0.PM.m_map.
      super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.PM.m_map.
                    super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.s1._M_dataplus._M_p != &local_1c0.s1.field_2) {
    operator_delete(local_1c0.s1._M_dataplus._M_p);
  }
  if (local_e0._M_current != local_d0) {
    operator_delete(local_e0._M_current);
  }
LAB_01c440bb:
  Value::~Value(&local_70);
  return;
}

Assistant:

static void CachedFunction(Vector &constant, Vector &other, Vector &result, DataChunk &args) {
	auto val = constant.GetValue(0);
	idx_t count = args.size();
	if (val.IsNull()) {
		auto &result_validity = FlatVector::Validity(result);
		result_validity.SetAllInvalid(count);
		return;
	}

	auto str_val = StringValue::Get(val);
	auto cached = CACHED_SIMILARITY(str_val);

	D_ASSERT(args.ColumnCount() == 2 || args.ColumnCount() == 3);
	if (args.ColumnCount() == 2) {
		UnaryExecutor::Execute<string_t, double>(other, result, count, [&](const string_t &other_str) {
			auto other_str_begin = other_str.GetData();
			return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize());
		});
	} else {
		auto score_cutoff = args.data[2];
		BinaryExecutor::Execute<string_t, double_t, double>(
		    other, score_cutoff, result, count, [&](const string_t &other_str, const double_t score_cutoff) {
			    auto other_str_begin = other_str.GetData();
			    return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize(), score_cutoff);
		    });
	}
}